

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

double crnlib::image_utils::compute_ssim(image_u8 *a,image_u8 *b,int channel_index)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  long lVar5;
  uint ix;
  uint uVar6;
  long lVar7;
  int y;
  uint uVar8;
  int iVar9;
  uint8 *puVar10;
  double dVar11;
  double local_d0;
  uint8 *local_c0;
  uint8 sy [36];
  uint8 sx [36];
  
  uVar3 = 0;
  local_d0 = 0.0;
  for (uVar6 = 0; uVar6 < a->m_height; uVar6 = uVar6 + 6) {
    uVar8 = 0;
    while( true ) {
      puVar10 = sy;
      local_c0 = sx;
      if (a->m_width <= uVar8) break;
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        y = uVar6 + (int)lVar5;
        for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
          iVar9 = uVar8 + (int)lVar7;
          pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped(a,iVar9,y);
          if (channel_index < 0) {
            iVar2 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            local_c0[lVar7] = (uint8)iVar2;
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped(b,iVar9,y);
            iVar9 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            uVar1 = (uchar)iVar9;
          }
          else {
            local_c0[lVar7] = (pcVar4->field_0).c[(uint)channel_index];
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped(b,iVar9,y);
            uVar1 = (pcVar4->field_0).c[(uint)channel_index];
          }
          puVar10[lVar7] = uVar1;
        }
        puVar10 = puVar10 + 6;
        local_c0 = local_c0 + 6;
      }
      dVar11 = compute_block_ssim(0x24,sx,sy);
      local_d0 = local_d0 + dVar11;
      uVar3 = uVar3 + 1;
      uVar8 = uVar8 + 6;
    }
  }
  dVar11 = 0.0;
  if (uVar3 != 0) {
    dVar11 = local_d0 / (double)uVar3;
  }
  return dVar11;
}

Assistant:

double compute_ssim(const image_u8& a, const image_u8& b, int channel_index) {
  const uint N = 6;
  uint8 sx[N * N], sy[N * N];

  double total_ssim = 0.0f;
  uint total_blocks = 0;

  //image_u8 yimg((a.get_width() + N - 1) / N, (a.get_height() + N - 1) / N);

  for (uint y = 0; y < a.get_height(); y += N) {
    for (uint x = 0; x < a.get_width(); x += N) {
      for (uint iy = 0; iy < N; iy++) {
        for (uint ix = 0; ix < N; ix++) {
          if (channel_index < 0)
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy).get_luma();
          else
            sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy)[channel_index];

          if (channel_index < 0)
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy).get_luma();
          else
            sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy)[channel_index];
        }
      }

      double ssim = compute_block_ssim(N * N, sx, sy);
      total_ssim += ssim;
      total_blocks++;

      //uint ssim_c = (uint)math::clamp<double>(ssim * 127.0f + 128.0f, 0, 255);
      //yimg(x / N, y / N).set(ssim_c, ssim_c, ssim_c, 255);
    }
  }

  if (!total_blocks)
    return 0.0f;

  //save_to_file_stb_or_miniz("ssim.tga", yimg, cWriteFlagGrayscale);

  return total_ssim / total_blocks;
}